

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_matchers_impl.hpp
# Opt level: O3

void __thiscall
Catch::MatchExpr<const_double_&,_IntegratorXX::Matchers::WithinAbsMatcher>::
streamReconstructedExpression
          (MatchExpr<const_double_&,_IntegratorXX::Matchers::WithinAbsMatcher> *this,ostream *os)

{
  ostream *poVar1;
  string local_58;
  string local_38;
  
  StringMaker<double,void>::convert_abi_cxx11_
            (&local_38,(StringMaker<double,void> *)os,*this->m_arg);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_38._M_dataplus._M_p,local_38._M_string_length);
  local_58._M_dataplus._M_p._0_1_ = 0x20;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_58,1);
  Matchers::MatcherUntypedBase::toString_abi_cxx11_(&local_58,(MatcherUntypedBase *)this->m_matcher)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_
                                    ),local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) !=
      &local_58.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream& os ) const override {
            os << Catch::Detail::stringify( m_arg )
               << ' '
               << m_matcher.toString();
        }